

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v7::detail::count_digits<4u,fmt::v7::detail::fallback_uintptr>(fallback_uintptr n)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  fallback_uintptr n_local;
  
  n_local = n;
  uVar4 = 8;
  do {
    uVar3 = (ulong)(uVar4 - 1);
    if (n_local.value[uVar3] != '\0') goto LAB_004d37ae;
    uVar4 = uVar4 - 1;
  } while (1 < uVar4);
  uVar3 = 0;
LAB_004d37ae:
  iVar2 = (int)uVar3 * 2;
  uVar4 = (uint)n_local.value[uVar3];
  do {
    iVar2 = iVar2 + 1;
    bVar1 = 0xf < uVar4;
    uVar4 = uVar4 >> 4;
  } while (bVar1);
  return iVar2;
}

Assistant:

FMT_FUNC int count_digits<4>(detail::fallback_uintptr n) {
  // fallback_uintptr is always stored in little endian.
  int i = static_cast<int>(sizeof(void*)) - 1;
  while (i > 0 && n.value[i] == 0) --i;
  auto char_digits = std::numeric_limits<unsigned char>::digits / 4;
  return i >= 0 ? i * char_digits + count_digits<4, unsigned>(n.value[i]) : 1;
}